

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

int ON_KnotVectorSpanCount(int order,int cv_count,double *knot)

{
  int local_28;
  int local_24;
  int span_count;
  int i;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  if (knot == (double *)0x0) {
    if ((order != 0) || (cv_count != 0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0xa6,"","nullptr knot[] passed to ON_KnotVectorSpanCount.");
    }
    cv_count_local = 0;
  }
  else {
    local_28 = 0;
    for (local_24 = order + -1; local_24 < cv_count; local_24 = local_24 + 1) {
      if (knot[local_24 + -1] <= knot[local_24] && knot[local_24] != knot[local_24 + -1]) {
        local_28 = local_28 + 1;
      }
    }
    cv_count_local = local_28;
  }
  return cv_count_local;
}

Assistant:

int ON_KnotVectorSpanCount(
          int order,         // order (>=2)
          int cv_count,      // cv count
          const double* knot // knot[] array
          )
{
  if ( 0 == knot )
  {
    if ( 0 != order || 0 != cv_count )
    {
      ON_ERROR("nullptr knot[] passed to ON_KnotVectorSpanCount.");
    }
    return 0;
  }
  int i, span_count = 0;
  for ( i = order-1; i < cv_count; i++ ) {
    if ( knot[i] > knot[i-1] )
      span_count++;
  }
  return span_count;
}